

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

void __thiscall
Model_setAndCheckIdsAllEntities_Test::TestBody(Model_setAndCheckIdsAllEntities_Test *this)

{
  element_type *peVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  char *pcVar7;
  string a;
  PrinterPtr printer;
  ModelPtr m;
  AssertHelper local_d8 [8];
  Message local_d0 [8];
  UnitsPtr u1;
  ComponentPtr c2;
  ResetPtr r1;
  VariablePtr v;
  ComponentPtr c1;
  UnitsPtr u3;
  UnitsPtr u2;
  ImportSourcePtr i2;
  AssertionResult gtest_ar;
  ImportSourcePtr i1;
  string e;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"mname\" id=\"mid\">\n  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"some-other-model.xml\" id=\"i1id\">\n    <component component_ref=\"a_component_in_that_model\" name=\"c1name\" id=\"c1id\"/>\n  </import>\n  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"some-other-different-model.xml\" id=\"i2id\">\n    <units units_ref=\"a_units_in_that_model\" name=\"u1name\" id=\"u1id\"/>\n  </import>\n  <units name=\"u2name\" id=\"u2id\"/>\n  <units name=\"u3name\" id=\"u3id\"/>\n  <component name=\"c2name\" id=\"c2id\">\n    <variable name=\"vname\" units=\"u1name\" id=\"vid\"/>\n    <reset id=\"r1id\">\n      <test_value id=\"tvid\"/>\n      <reset_value id=\"rvid\"/>\n    </reset>\n  </component>\n</model>\n"
             ,(allocator<char> *)&a);
  libcellml::Model::create();
  libcellml::ImportSource::create();
  libcellml::ImportSource::create();
  libcellml::Component::create();
  libcellml::Component::create();
  libcellml::Variable::create();
  libcellml::Units::create();
  libcellml::Units::create();
  libcellml::Units::create();
  libcellml::Reset::create();
  peVar6 = i1.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a,"some-other-model.xml",(allocator<char> *)&printer);
  libcellml::ImportSource::setUrl((string *)peVar6);
  std::__cxx11::string::~string((string *)&a);
  peVar3 = c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a,"a_component_in_that_model",(allocator<char> *)&printer);
  libcellml::Component::setSourceComponent((shared_ptr *)peVar3,(string *)&i1);
  std::__cxx11::string::~string((string *)&a);
  peVar6 = i2.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a,"some-other-different-model.xml",(allocator<char> *)&printer);
  libcellml::ImportSource::setUrl((string *)peVar6);
  std::__cxx11::string::~string((string *)&a);
  peVar2 = u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a,"a_units_in_that_model",(allocator<char> *)&printer);
  libcellml::Units::setSourceUnits((shared_ptr *)peVar2,(string *)&i2);
  std::__cxx11::string::~string((string *)&a);
  peVar1 = m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a,"mname",(allocator<char> *)&printer);
  libcellml::NamedEntity::setName((string *)peVar1);
  std::__cxx11::string::~string((string *)&a);
  peVar3 = c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a,"c1name",(allocator<char> *)&printer);
  libcellml::NamedEntity::setName((string *)peVar3);
  std::__cxx11::string::~string((string *)&a);
  peVar3 = c2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a,"c2name",(allocator<char> *)&printer);
  libcellml::NamedEntity::setName((string *)peVar3);
  std::__cxx11::string::~string((string *)&a);
  peVar5 = v.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a,"vname",(allocator<char> *)&printer);
  libcellml::NamedEntity::setName((string *)peVar5);
  std::__cxx11::string::~string((string *)&a);
  peVar2 = u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a,"u1name",(allocator<char> *)&printer);
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string((string *)&a);
  peVar2 = u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a,"u2name",(allocator<char> *)&printer);
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string((string *)&a);
  peVar2 = u3.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a,"u3name",(allocator<char> *)&printer);
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string((string *)&a);
  peVar1 = m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&a,"mid",(allocator<char> *)&printer)
  ;
  libcellml::Entity::setId((string *)peVar1);
  std::__cxx11::string::~string((string *)&a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a,"i1id",(allocator<char> *)&printer);
  libcellml::Entity::setId
            ((string *)
             i1.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)&a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a,"i2id",(allocator<char> *)&printer);
  libcellml::Entity::setId
            ((string *)
             i2.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)&a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a,"c1id",(allocator<char> *)&printer);
  libcellml::Entity::setId
            ((string *)
             c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)&a);
  peVar3 = c2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a,"c2id",(allocator<char> *)&printer);
  libcellml::Entity::setId((string *)peVar3);
  std::__cxx11::string::~string((string *)&a);
  peVar5 = v.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&a,"vid",(allocator<char> *)&printer)
  ;
  libcellml::Entity::setId((string *)peVar5);
  std::__cxx11::string::~string((string *)&a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a,"u1id",(allocator<char> *)&printer);
  libcellml::Entity::setId
            ((string *)u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)&a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a,"u2id",(allocator<char> *)&printer);
  libcellml::Entity::setId
            ((string *)u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)&a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a,"u3id",(allocator<char> *)&printer);
  libcellml::Entity::setId
            ((string *)u3.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)&a);
  peVar4 = r1.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a,"r1id",(allocator<char> *)&printer);
  libcellml::Entity::setId((string *)peVar4);
  std::__cxx11::string::~string((string *)&a);
  peVar4 = r1.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a,"tvid",(allocator<char> *)&printer);
  libcellml::Reset::setTestValueId((string *)peVar4);
  std::__cxx11::string::~string((string *)&a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a,"rvid",(allocator<char> *)&printer);
  libcellml::Reset::setResetValueId
            ((string *)r1.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)&a);
  libcellml::Variable::setUnits
            ((shared_ptr *)
             v.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Component::addReset
            ((shared_ptr *)
             c2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Component::addVariable
            ((shared_ptr *)
             c2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  libcellml::Model::addUnits
            ((shared_ptr *)m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  libcellml::Model::addUnits
            ((shared_ptr *)m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  libcellml::ComponentEntity::addComponent
            ((shared_ptr *)m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  libcellml::ComponentEntity::addComponent
            ((shared_ptr *)m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  libcellml::Printer::create();
  libcellml::Printer::printModel_abi_cxx11_
            ((shared_ptr *)&a,
             (bool)printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   ._0_1_);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"a","e",&a,&e);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(local_d0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/model.cpp"
               ,0x22e,pcVar7);
    testing::internal::AssertHelper::operator=(local_d8,local_d0);
    testing::internal::AssertHelper::~AssertHelper(local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&a);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&r1.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u3.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&v.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&i2.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&i1.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&e);
  return;
}

Assistant:

TEST(Model, setAndCheckIdsAllEntities)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"mname\" id=\"mid\">\n"
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"some-other-model.xml\" id=\"i1id\">\n"
        "    <component component_ref=\"a_component_in_that_model\" name=\"c1name\" id=\"c1id\"/>\n"
        "  </import>\n"
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"some-other-different-model.xml\" id=\"i2id\">\n"
        "    <units units_ref=\"a_units_in_that_model\" name=\"u1name\" id=\"u1id\"/>\n"
        "  </import>\n"
        "  <units name=\"u2name\" id=\"u2id\"/>\n"
        "  <units name=\"u3name\" id=\"u3id\"/>\n"
        "  <component name=\"c2name\" id=\"c2id\">\n"
        "    <variable name=\"vname\" units=\"u1name\" id=\"vid\"/>\n"
        "    <reset id=\"r1id\">\n"
        "      <test_value id=\"tvid\"/>\n"
        "      <reset_value id=\"rvid\"/>\n"
        "    </reset>\n"
        "  </component>\n"
        "</model>\n";

    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ImportSourcePtr i1 = libcellml::ImportSource::create();
    libcellml::ImportSourcePtr i2 = libcellml::ImportSource::create();
    libcellml::ComponentPtr c1 = libcellml::Component::create();
    libcellml::ComponentPtr c2 = libcellml::Component::create();
    libcellml::VariablePtr v = libcellml::Variable::create();
    libcellml::UnitsPtr u1 = libcellml::Units::create();
    libcellml::UnitsPtr u2 = libcellml::Units::create();
    libcellml::UnitsPtr u3 = libcellml::Units::create();
    libcellml::ResetPtr r1 = libcellml::Reset::create();

    i1->setUrl("some-other-model.xml");
    c1->setSourceComponent(i1, "a_component_in_that_model");

    i2->setUrl("some-other-different-model.xml");
    u1->setSourceUnits(i2, "a_units_in_that_model");

    m->setName("mname");
    c1->setName("c1name");
    c2->setName("c2name");
    v->setName("vname");
    u1->setName("u1name");
    u2->setName("u2name");
    u3->setName("u3name");

    m->setId("mid");
    i1->setId("i1id");
    i2->setId("i2id");
    c1->setId("c1id");
    c2->setId("c2id");
    v->setId("vid");
    u1->setId("u1id");
    u2->setId("u2id");
    u3->setId("u3id");
    r1->setId("r1id");

    r1->setTestValueId("tvid");
    r1->setResetValueId("rvid");

    v->setUnits(u1);
    c2->addReset(r1);
    c2->addVariable(v);

    m->addUnits(u1);
    m->addUnits(u2);
    m->addUnits(u3);
    m->addComponent(c1);
    m->addComponent(c2);

    libcellml::PrinterPtr printer = libcellml::Printer::create();
    const std::string a = printer->printModel(m);
    EXPECT_EQ(a, e);
}